

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest03VerifyingNameChaining_::
Section3ValidUTF8StringEncodedNamesTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::Section3ValidUTF8StringEncodedNamesTest9
          (Section3ValidUTF8StringEncodedNamesTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section3ValidUTF8StringEncodedNamesTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  PkitsTest03VerifyingNameChaining<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
  PkitsTest03VerifyingNameChaining
            (&this->
              super_PkitsTest03VerifyingNameChaining<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
            );
  (this->
  super_PkitsTest03VerifyingNameChaining<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>)
  .super_PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>.super_Test._vptr_Test
       = (_func_int **)&PTR__Section3ValidUTF8StringEncodedNamesTest9_00926cc0;
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest03VerifyingNameChaining,
                     Section3ValidUTF8StringEncodedNamesTest9) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "UTF8StringEncodedNamesCACert",
                               "ValidUTF8StringEncodedNamesTest9EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "UTF8StringEncodedNamesCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.3.9";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}